

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,Point2f u)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  Transform *pTVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Tuple3<pbrt::Point3,_float> local_a8;
  undefined1 local_98 [16];
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  Point3fi local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar7 = auVar11._0_16_;
  local_98 = ZEXT416((uint)this->radius);
  auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar7,SUB6416(ZEXT464(0x3f800000),0));
  local_78._0_4_ = auVar10._0_4_;
  auVar10 = vfnmadd213ss_fma(auVar10,auVar10,SUB6416(ZEXT464(0x3f800000),0));
  auVar10 = vmaxss_avx(auVar10,ZEXT816(0));
  if (auVar10._0_4_ < 0.0) {
    local_68 = auVar7;
    auVar12._0_4_ = sqrtf(auVar10._0_4_);
    auVar12._4_60_ = extraout_var;
    local_48 = auVar12._0_16_;
    auVar7 = local_68;
  }
  else {
    local_48 = vsqrtss_avx(auVar10,auVar10);
  }
  auVar10 = vmovshdup_avx(auVar7);
  local_7c = auVar10._0_4_ * 6.2831855;
  local_68._0_4_ = cosf(local_7c);
  local_68._4_4_ = extraout_XMM0_Db;
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._12_4_ = extraout_XMM0_Dd;
  auVar13._0_4_ = sinf(local_7c);
  auVar13._4_60_ = extraout_var_00;
  auVar10 = vinsertps_avx(local_68,auVar13._0_16_,0x10);
  auVar7._0_4_ = (float)local_98._0_4_ * (float)local_48._0_4_ * auVar10._0_4_ + 0.0;
  auVar7._4_4_ = (float)local_98._0_4_ * (float)local_48._0_4_ * auVar10._4_4_ + 0.0;
  auVar7._8_4_ = (float)local_98._0_4_ * (float)local_48._0_4_ * auVar10._8_4_ + 0.0;
  auVar7._12_4_ = (float)local_98._0_4_ * (float)local_48._0_4_ * auVar10._12_4_ + 0.0;
  local_a8.z = (float)local_98._0_4_ * (float)local_78._0_4_ + 0.0;
  local_a8._0_8_ = vmovlps_avx(auVar7);
  auVar10._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar10._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar10._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar10._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar10 = vhaddps_avx(auVar10,auVar10);
  fVar9 = local_a8.z * local_a8.z + auVar10._0_4_;
  if (fVar9 < 0.0) {
    local_98._0_4_ = this->radius;
    fVar8 = sqrtf(fVar9);
    fVar9 = (float)local_98._0_4_;
  }
  else {
    auVar10 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
    fVar8 = auVar10._0_4_;
    fVar9 = this->radius;
  }
  fVar9 = fVar9 / fVar8;
  auVar14._0_4_ = local_a8.x * fVar9;
  auVar14._4_4_ = local_a8.y * fVar9;
  auVar14._8_4_ = fVar9 * 0.0;
  auVar14._12_4_ = fVar9 * 0.0;
  local_a8._0_8_ = vmovlps_avx(auVar14);
  local_a8.z = fVar9 * local_a8.z;
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  auVar20._4_4_ = local_a8.z;
  auVar20._0_4_ = local_a8.z;
  auVar20._8_4_ = local_a8.z;
  auVar20._12_4_ = local_a8.z;
  auVar10 = vandps_avx(auVar20,auVar18);
  auVar7 = vandps_avx(auVar14,auVar18);
  auVar6._8_4_ = 0x34a00003;
  auVar6._0_8_ = 0x34a0000334a00003;
  auVar6._12_4_ = 0x34a00003;
  auVar7 = vmulps_avx512vl(auVar7,auVar6);
  local_58.z = auVar10._0_4_ * 2.980233e-07;
  local_58._0_8_ = vmovlps_avx(auVar7);
  pTVar5 = this->renderFromObject;
  auVar10 = vmovshdup_avx(auVar14);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * (pTVar5->mInv).m[1][2])),auVar14,
                           ZEXT416((uint)(pTVar5->mInv).m[0][2]));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(pTVar5->mInv).m[0];
  uVar3 = *(undefined8 *)(pTVar5->mInv).m[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(pTVar5->mInv).m[2];
  auVar19._0_4_ = auVar10._0_4_ * (float)uVar3;
  auVar19._4_4_ = auVar10._4_4_ * (float)((ulong)uVar3 >> 0x20);
  auVar19._8_4_ = auVar10._8_4_ * 0.0;
  auVar19._12_4_ = auVar10._12_4_ * 0.0;
  auVar22._4_4_ = auVar14._0_4_;
  auVar22._0_4_ = auVar14._0_4_;
  auVar22._8_4_ = auVar14._0_4_;
  auVar22._12_4_ = auVar14._0_4_;
  auVar10 = vfmadd213ps_fma(auVar22,auVar21,auVar19);
  local_78 = vfmadd231ps_fma(auVar10,auVar20,auVar23);
  auVar15._0_4_ = local_78._0_4_ * local_78._0_4_;
  auVar15._4_4_ = local_78._4_4_ * local_78._4_4_;
  auVar15._8_4_ = local_78._8_4_ * local_78._8_4_;
  auVar15._12_4_ = local_78._12_4_ * local_78._12_4_;
  auVar10 = vhaddps_avx(auVar15,auVar15);
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_a8.z),ZEXT416((uint)(pTVar5->mInv).m[2][2]));
  fVar8 = auVar7._0_4_;
  fVar9 = auVar10._0_4_ + fVar8 * fVar8;
  if (fVar9 < 0.0) {
    local_98._0_4_ = fVar8;
    fVar9 = sqrtf(fVar9);
    auVar7 = ZEXT416((uint)local_98._0_4_);
  }
  else {
    auVar10 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
    fVar9 = auVar10._0_4_;
  }
  auVar16._4_4_ = fVar9;
  auVar16._0_4_ = fVar9;
  auVar16._8_4_ = fVar9;
  auVar16._12_4_ = fVar9;
  auVar10 = vdivps_avx(local_78,auVar16);
  fVar9 = auVar7._0_4_ / fVar9;
  bVar4 = this->reverseOrientation;
  local_98 = auVar10;
  if (bVar4 != false) {
    local_98._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
    local_98._8_4_ = auVar10._8_4_ ^ 0x80000000;
    local_98._12_4_ = auVar10._12_4_ ^ 0x80000000;
  }
  local_78._0_4_ = (uint)(bVar4 & 1) * (int)-fVar9 + (uint)!(bool)(bVar4 & 1) * (int)fVar9;
  local_78._4_12_ = auVar7._4_12_;
  pTVar5 = this->renderFromObject;
  Point3fi::Point3fi(&local_38,(Point3f *)&local_a8,(Vector3f *)&local_58);
  Transform::operator()((Point3fi *)__return_storage_ptr__,pTVar5,&local_38);
  fVar9 = this->zMax;
  fVar8 = this->phiMax;
  fVar1 = this->radius;
  fVar2 = this->zMin;
  __return_storage_ptr__->set = true;
  auVar17._0_12_ = ZEXT812(0);
  auVar17._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar17;
  uVar3 = vmovlps_avx(local_98);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_78._0_4_;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) = auVar17;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar17;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / (fVar8 * fVar1 * (fVar9 - fVar2));
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> Sphere::Sample(Point2f u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseOrientation)
        n *= -1;
    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n), 1 / Area()};
}